

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_DisallowServicesNoServices_Test
::TestBody(CommandLineInterfaceTest_DisallowServicesNoServices_Test *this)

{
  string_view name;
  string_view contents;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str = "syntax = \"proto2\";\nmessage Foo {}\n";
  contents._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "protocol_compiler --disallow_services --test_out=$tmpdir --proto_path=$tmpdir foo.proto"
             ,(allocator<char> *)&local_a8);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"test_generator",&local_a9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_651463 + 5,&local_aa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"foo.proto",&local_ab);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Foo",&local_ac);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_a8,&local_48,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, DisallowServicesNoServices) {
  // Test that --disallow_services doesn't cause a problem when there are no
  // services.

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");

  Run("protocol_compiler --disallow_services --test_out=$tmpdir "
      "--proto_path=$tmpdir foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "foo.proto", "Foo");
}